

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tts.cpp
# Opt level: O0

void prompt_add(llama_tokens *prompt,llama_vocab *vocab,string *txt,bool add_special,
               bool parse_special)

{
  byte bVar1;
  byte in_CL;
  byte bVar2;
  byte in_R8B;
  vector<int,_std::allocator<int>_> tmp;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffc0;
  llama_tokens *in_stack_ffffffffffffffd8;
  undefined6 in_stack_ffffffffffffffe0;
  
  bVar2 = in_CL & 1;
  bVar1 = in_R8B & 1;
  common_tokenize(vocab,txt,add_special,parse_special);
  prompt_add((llama_tokens *)CONCAT17(bVar2,CONCAT16(bVar1,in_stack_ffffffffffffffe0)),
             in_stack_ffffffffffffffd8);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffffc0);
  return;
}

Assistant:

static void prompt_add(llama_tokens & prompt, const llama_vocab * vocab, const std::string & txt, bool add_special, bool parse_special) {
    auto tmp = common_tokenize(vocab, txt, add_special, parse_special);
    prompt_add(prompt, tmp);
}